

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outqueue.c
# Opt level: O3

lzma_ret lzma_outq_init(lzma_outq *outq,lzma_allocator *allocator,uint64_t buf_size_max,
                       uint32_t threads)

{
  uint uVar1;
  lzma_ret lVar2;
  lzma_outbuf *plVar3;
  uint8_t *puVar4;
  
  lVar2 = LZMA_OPTIONS_ERROR;
  if (buf_size_max >> 0x30 == 0 && threads < 0x4001) {
    uVar1 = threads * 2;
    if ((outq->buf_size_max != buf_size_max) || (outq->bufs_allocated != uVar1)) {
      lzma_free(outq->bufs,allocator);
      outq->bufs = (lzma_outbuf *)0x0;
      lzma_free(outq->bufs_mem,allocator);
      outq->bufs_mem = (uint8_t *)0x0;
      plVar3 = (lzma_outbuf *)lzma_alloc((ulong)(threads * 0x50),allocator);
      outq->bufs = plVar3;
      puVar4 = (uint8_t *)lzma_alloc(uVar1 * buf_size_max,allocator);
      outq->bufs_mem = puVar4;
      if (puVar4 == (uint8_t *)0x0 || outq->bufs == (lzma_outbuf *)0x0) {
        lzma_free(outq->bufs,allocator);
        outq->bufs = (lzma_outbuf *)0x0;
        lzma_free(outq->bufs_mem,allocator);
        outq->bufs_mem = (uint8_t *)0x0;
        return LZMA_MEM_ERROR;
      }
    }
    outq->buf_size_max = buf_size_max;
    outq->bufs_allocated = uVar1;
    lVar2 = LZMA_OK;
    outq->bufs_pos = 0;
    outq->bufs_used = 0;
    outq->read_pos = 0;
  }
  return lVar2;
}

Assistant:

extern lzma_ret
lzma_outq_init(lzma_outq *outq, const lzma_allocator *allocator,
		uint64_t buf_size_max, uint32_t threads)
{
	uint64_t bufs_alloc_size;
	uint32_t bufs_count;

	// Set bufs_count and bufs_alloc_size.
	return_if_error(get_options(&bufs_alloc_size, &bufs_count,
			buf_size_max, threads));

	// Allocate memory if needed.
	if (outq->buf_size_max != buf_size_max
			|| outq->bufs_allocated != bufs_count) {
		lzma_outq_end(outq, allocator);

#if SIZE_MAX < UINT64_MAX
		if (bufs_alloc_size > SIZE_MAX)
			return LZMA_MEM_ERROR;
#endif

		outq->bufs = lzma_alloc(bufs_count * sizeof(lzma_outbuf),
				allocator);
		outq->bufs_mem = lzma_alloc((size_t)(bufs_alloc_size),
				allocator);

		if (outq->bufs == NULL || outq->bufs_mem == NULL) {
			lzma_outq_end(outq, allocator);
			return LZMA_MEM_ERROR;
		}
	}

	// Initialize the rest of the main structure. Initialization of
	// outq->bufs[] is done when they are actually needed.
	outq->buf_size_max = (size_t)(buf_size_max);
	outq->bufs_allocated = bufs_count;
	outq->bufs_pos = 0;
	outq->bufs_used = 0;
	outq->read_pos = 0;

	return LZMA_OK;
}